

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::SubroutineSymbol::addThisVar(SubroutineSymbol *this,Type *type)

{
  bitmask<slang::ast::VariableFlags> bVar1;
  VariableSymbol *pVVar2;
  Type *in_RDI;
  SourceLocation *unaff_retaddr;
  char (*in_stack_00000008) [5];
  VariableSymbol *tv;
  undefined2 in_stack_ffffffffffffffe0;
  bitmask<slang::ast::VariableFlags> in_stack_ffffffffffffffe2;
  VariableFlags l;
  undefined2 uVar3;
  Type *args_2;
  
  args_2 = in_RDI;
  Scope::getCompilation((Scope *)&in_RDI->canonical);
  l = None;
  uVar3 = 0;
  pVVar2 = BumpAllocator::
           emplace<slang::ast::VariableSymbol,char_const(&)[5],slang::SourceLocation_const&,slang::ast::VariableLifetime>
                     ((BumpAllocator *)tv,in_stack_00000008,unaff_retaddr,(VariableLifetime *)args_2
                     );
  ValueSymbol::setType
            ((ValueSymbol *)
             CONCAT26(uVar3,CONCAT24(l,CONCAT22(in_stack_ffffffffffffffe2.m_bits,
                                                in_stack_ffffffffffffffe0))),in_RDI);
  bVar1 = ast::operator|(l,in_stack_ffffffffffffffe2.m_bits);
  bitmask<slang::ast::VariableFlags>::operator|=
            (&pVVar2->flags,(bitmask<slang::ast::VariableFlags> *)&stack0xffffffffffffffe2);
  *(VariableSymbol **)&in_RDI[3].super_Symbol = pVVar2;
  Scope::addMember((Scope *)CONCAT26(uVar3,CONCAT24(l,CONCAT22(bVar1.m_bits,
                                                               in_stack_ffffffffffffffe0))),
                   &in_RDI->super_Symbol);
  return;
}

Assistant:

void SubroutineSymbol::addThisVar(const Type& type) {
    auto tv = getCompilation().emplace<VariableSymbol>("this", type.location,
                                                       VariableLifetime::Automatic);
    tv->setType(type);
    tv->flags |= VariableFlags::Const | VariableFlags::CompilerGenerated;
    thisVar = tv;
    addMember(*thisVar);
}